

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O0

ChCoordsys<double> * __thiscall
chrono::ChCoordsys<double>::TransformLocalToParent
          (ChCoordsys<double> *__return_storage_ptr__,ChCoordsys<double> *this,
          ChCoordsys<double> *local)

{
  ChQuaternion<double> local_58;
  ChVector<double> local_38;
  ChCoordsys<double> *local_20;
  ChCoordsys<double> *local_local;
  ChCoordsys<double> *this_local;
  
  local_20 = local;
  local_local = this;
  this_local = __return_storage_ptr__;
  TransformLocalToParent(&local_38,this,&local->pos);
  ChQuaternion<double>::operator%(&local_58,&this->rot,&local_20->rot);
  ChCoordsys(__return_storage_ptr__,&local_38,&local_58);
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<Real> TransformLocalToParent(const ChCoordsys<Real>& local) const {
        return ChCoordsys<Real>(TransformLocalToParent(local.pos), rot % local.rot);
    }